

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O0

bool DecodeBase58Check(char *psz,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchRet,
                      int max_ret_len)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  int *piVar5;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  Span<unsigned_char> *in_RDI;
  long in_FS_OFFSET;
  uint256 hash;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  Span<unsigned_char> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  bool local_49;
  int local_28;
  int in_stack_ffffffffffffffe4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = std::numeric_limits<int>::max();
  if (iVar3 + -4 < in_EDX) {
    iVar3 = std::numeric_limits<int>::max();
  }
  else {
    iVar3 = in_EDX + 4;
  }
  bVar2 = DecodeBase58(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4
                      );
  if ((bVar2) &&
     (sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)), 3 < sVar4))
  {
    Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (type)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    Span<unsigned_char>::first(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    Hash<Span<unsigned_char>>(in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    piVar5 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (in_RSI,(size_type)in_stack_ffffffffffffff70);
    if (local_28 == *piVar5) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                 CONCAT44(iVar3,in_stack_ffffffffffffff80));
      local_49 = true;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      local_49 = false;
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_49 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

[[nodiscard]] static bool DecodeBase58Check(const char* psz, std::vector<unsigned char>& vchRet, int max_ret_len)
{
    if (!DecodeBase58(psz, vchRet, max_ret_len > std::numeric_limits<int>::max() - 4 ? std::numeric_limits<int>::max() : max_ret_len + 4) ||
        (vchRet.size() < 4)) {
        vchRet.clear();
        return false;
    }
    // re-calculate the checksum, ensure it matches the included 4-byte checksum
    uint256 hash = Hash(Span{vchRet}.first(vchRet.size() - 4));
    if (memcmp(&hash, &vchRet[vchRet.size() - 4], 4) != 0) {
        vchRet.clear();
        return false;
    }
    vchRet.resize(vchRet.size() - 4);
    return true;
}